

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineCam.cpp
# Opt level: O3

void __thiscall chrono::geometry::ChLineCam::ArchiveIN(ChLineCam *this,ChArchiveIn *marchive)

{
  eChCamType_mapper mmapper;
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  ChEnumMapper<chrono::geometry::eChCamType> local_78;
  eChCamType_mapper local_58;
  shared_ptr<chrono::ChFunction> local_38;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChLineCam>(marchive);
  ChLine::ArchiveIN(&this->super_ChLine,marchive);
  eChCamType_mapper::eChCamType_mapper(&local_58);
  eChCamType_mapper::operator()(&local_78,&local_58,&this->type);
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x9f6387;
  local_28 = 0;
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_78;
  (**(code **)(*(long *)marchive + 0x58))(marchive,&local_38);
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b3e348
  ;
  if (local_78.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_78.value_ptr = (eChCamType *)&this->law;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9d9c04;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_78);
  local_78.value_ptr = (eChCamType *)&this->phase;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9ecac3;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->Rb;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9d9c08;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->Rr;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9d9c0b;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->p;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9f16df;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->d;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x952539;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->b0;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9d9c0e;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->e;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9f6583;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->s;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x958a9a;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->negative;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9d9c11;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive);
  local_78.value_ptr = (eChCamType *)&this->internal;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9d9c1a;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive);
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->center;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9f4147;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ChFunctorArchiveIn_00b03258;
  local_78.value_ptr = (eChCamType *)&local_38;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_58.super_ChEnumMapper<chrono::geometry::eChCamType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b3e348;
  if (local_58.super_ChEnumMapper<chrono::geometry::eChCamType>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super_ChEnumMapper<chrono::geometry::eChCamType>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChLineCam::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLineCam>();
    // deserialize parent class
    ChLine::ArchiveIN(marchive);
    // stream in all member data:
    eChCamType_mapper mmapper;
    marchive >> CHNVP(mmapper(type), "type");
    marchive >> CHNVP(law);
    marchive >> CHNVP(phase);
    marchive >> CHNVP(Rb);
    marchive >> CHNVP(Rr);
    marchive >> CHNVP(p);
    marchive >> CHNVP(d);
    marchive >> CHNVP(b0);
    marchive >> CHNVP(e);
    marchive >> CHNVP(s);
    marchive >> CHNVP(negative);
    marchive >> CHNVP(internal);
    marchive >> CHNVP(center);
}